

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::BitVector::setRange
          (BitVector *this,size_t offset,size_t count,bool value)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = count + offset;
  for (; (offset < uVar1 && ((offset & 0x1f) != 0)); offset = offset + 1) {
    set(this,offset,value);
  }
  uVar2 = uVar1 & 0xffffffffffffffe0;
  if (offset <= uVar2 && uVar2 - offset != 0) {
    memset((void *)((offset >> 3 & 0xfffffffffffffffc) +
                   (long)(this->m_data).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start),-(uint)value,uVar2 - offset >> 3);
    offset = uVar2;
  }
  for (; offset < uVar1; offset = offset + 1) {
    set(this,offset,value);
  }
  return;
}

Assistant:

void setRange (size_t offset, size_t count, bool value)
	{
		size_t ndx = offset;

		for (; (ndx < offset + count) && ((ndx % BLOCK_BIT_SIZE) != 0); ndx++)
		{
			DE_ASSERT(ndx >= offset);
			DE_ASSERT(ndx < offset + count);
			set(ndx, value);
		}

		{
			const size_t endOfFullBlockNdx = roundDownToMultiple<size_t>(offset + count, BLOCK_BIT_SIZE);

			if (ndx < endOfFullBlockNdx)
			{
				deMemset(&m_data[ndx / BLOCK_BIT_SIZE], (value ? 0xFF : 0x0), (endOfFullBlockNdx - ndx) / 8);
				ndx = endOfFullBlockNdx;
			}
		}

		for (; ndx < offset + count; ndx++)
		{
			DE_ASSERT(ndx >= offset);
			DE_ASSERT(ndx < offset + count);
			set(ndx, value);
		}
	}